

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O2

bool __thiscall
SpiAnalyzer::WouldAdvancingTheClockToggleEnable
          (SpiAnalyzer *this,bool add_disable_frame,U64 *disable_frame)

{
  char cVar1;
  bool bVar2;
  BitState BVar3;
  U64 enable_edge;
  anon_class_24_3_692f4939 log_disable_event;
  bool local_31;
  U64 *local_30;
  anon_class_24_3_692f4939 local_28;
  
  if (this->mEnable == (AnalyzerChannelData *)0x0) {
LAB_00107755:
    bVar2 = false;
  }
  else {
    local_28.add_disable_frame = &local_31;
    local_28.disable_frame = &local_30;
    local_31 = add_disable_frame;
    local_30 = disable_frame;
    local_28.this = this;
    cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar1 == '\0') {
      BVar3 = AnalyzerChannelData::GetBitState();
      if (BVar3 != ((this->mSettings)._M_ptr)->mEnableActiveState) goto LAB_00107716;
      cVar1 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if (cVar1 == '\0') goto LAB_00107716;
      enable_edge = AnalyzerChannelData::GetSampleOfNextEdge();
      cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                        ((ulonglong)this->mClock);
      if (cVar1 != '\0') goto LAB_00107716;
    }
    else {
LAB_00107716:
      AnalyzerChannelData::GetSampleOfNextEdge();
      cVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                        ((ulonglong)this->mEnable);
      if (cVar1 == '\0') goto LAB_00107755;
      enable_edge = AnalyzerChannelData::GetSampleOfNextEdge();
    }
    WouldAdvancingTheClockToggleEnable::anon_class_24_3_692f4939::operator()(&local_28,enable_edge);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SpiAnalyzer::WouldAdvancingTheClockToggleEnable( bool add_disable_frame, U64* disable_frame )
{
    if( mEnable == NULL )
        return false;

    auto log_disable_event = [&]( U64 enable_edge ) {
        if( add_disable_frame )
        {
            FrameV2 frame_v2_end_of_transaction;
            mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", enable_edge, enable_edge + 1 );
        }
        else if( disable_frame != nullptr )
        {
            *disable_frame = enable_edge;
        }
    };

    // if the enable is currently active, and there are no more clock transitions in the capture, attempt to capture the final disable event
    if( !mClock->DoMoreTransitionsExistInCurrentData() && mEnable->GetBitState() == mSettings->mEnableActiveState )
    {
        if( mEnable->DoMoreTransitionsExistInCurrentData() )
        {
            U64 next_enable_edge = mEnable->GetSampleOfNextEdge();
            // double check that the clock line actually processed all samples up to the next enable edge.
            // double check is required becase data is getting processed while we're running, it's possible more has already become
            // available.
            if( !mClock->WouldAdvancingToAbsPositionCauseTransition( next_enable_edge ) )
            {
                log_disable_event( next_enable_edge );
                return true;
            }
        }
    }

    U64 next_edge = mClock->GetSampleOfNextEdge();
    bool enable_will_toggle = mEnable->WouldAdvancingToAbsPositionCauseTransition( next_edge );

    if( enable_will_toggle )
    {
        U64 enable_edge = mEnable->GetSampleOfNextEdge();
        log_disable_event( enable_edge );
    }

    if( enable_will_toggle == false )
        return false;
    else
        return true;
}